

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O0

void __thiscall
andres::marray_detail::Geometry<std::allocator<unsigned_long>>::Geometry<unsigned_long*>
          (Geometry<std::allocator<unsigned_long>> *this,unsigned_long *begin,unsigned_long *end,
          CoordinateOrder *externalCoordinateOrder,CoordinateOrder *internalCoordinateOrder,
          allocator_type *allocator)

{
  long lVar1;
  difference_type dVar2;
  unsigned_long *puVar3;
  size_t sVar4;
  size_t *psVar5;
  size_t *psVar6;
  size_t *psVar7;
  size_t s;
  size_t j;
  allocator_type *allocator_local;
  CoordinateOrder *internalCoordinateOrder_local;
  CoordinateOrder *externalCoordinateOrder_local;
  unsigned_long *end_local;
  unsigned_long *begin_local;
  Geometry<std::allocator<unsigned_long>_> *this_local;
  
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)this,allocator);
  dVar2 = std::distance<unsigned_long*>(begin,end);
  puVar3 = __gnu_cxx::new_allocator<unsigned_long>::allocate
                     ((new_allocator<unsigned_long> *)this,dVar2 * 3,(void *)0x0);
  *(unsigned_long **)(this + 8) = puVar3;
  lVar1 = *(long *)(this + 8);
  dVar2 = std::distance<unsigned_long*>(begin,end);
  *(long *)(this + 0x10) = lVar1 + dVar2 * 8;
  lVar1 = *(long *)(this + 0x10);
  dVar2 = std::distance<unsigned_long*>(begin,end);
  *(long *)(this + 0x18) = lVar1 + dVar2 * 8;
  dVar2 = std::distance<unsigned_long*>(begin,end);
  *(difference_type *)(this + 0x20) = dVar2;
  *(undefined8 *)(this + 0x28) = 1;
  *(CoordinateOrder *)(this + 0x30) = *internalCoordinateOrder;
  this[0x34] = (Geometry<std::allocator<unsigned_long>>)0x1;
  if (*(long *)(this + 0x20) != 0) {
    this[0x34] = (Geometry<std::allocator<unsigned_long>>)
                 (*externalCoordinateOrder == *internalCoordinateOrder);
    s = 0;
    end_local = begin;
    while( true ) {
      sVar4 = Geometry<std::allocator<unsigned_long>_>::dimension
                        ((Geometry<std::allocator<unsigned_long>_> *)this);
      if (sVar4 <= s) break;
      sVar4 = *end_local;
      psVar5 = Geometry<std::allocator<unsigned_long>_>::shape
                         ((Geometry<std::allocator<unsigned_long>_> *)this,s);
      *psVar5 = sVar4;
      psVar5 = Geometry<std::allocator<unsigned_long>_>::size
                         ((Geometry<std::allocator<unsigned_long>_> *)this);
      *psVar5 = sVar4 * *psVar5;
      s = s + 1;
      end_local = end_local + 1;
    }
    psVar5 = Geometry<std::allocator<unsigned_long>_>::shapeBegin
                       ((Geometry<std::allocator<unsigned_long>_> *)this);
    psVar6 = Geometry<std::allocator<unsigned_long>_>::shapeEnd
                       ((Geometry<std::allocator<unsigned_long>_> *)this);
    psVar7 = Geometry<std::allocator<unsigned_long>_>::stridesBegin
                       ((Geometry<std::allocator<unsigned_long>_> *)this);
    stridesFromShape<unsigned_long*,unsigned_long*>(psVar5,psVar6,psVar7,externalCoordinateOrder);
    psVar5 = Geometry<std::allocator<unsigned_long>_>::shapeBegin
                       ((Geometry<std::allocator<unsigned_long>_> *)this);
    psVar6 = Geometry<std::allocator<unsigned_long>_>::shapeEnd
                       ((Geometry<std::allocator<unsigned_long>_> *)this);
    psVar7 = Geometry<std::allocator<unsigned_long>_>::shapeStridesBegin
                       ((Geometry<std::allocator<unsigned_long>_> *)this);
    stridesFromShape<unsigned_long*,unsigned_long*>(psVar5,psVar6,psVar7,internalCoordinateOrder);
  }
  return;
}

Assistant:

inline 
Geometry<A>::Geometry
(
    ShapeIterator begin, 
    ShapeIterator end,
    const CoordinateOrder& externalCoordinateOrder,
    const CoordinateOrder& internalCoordinateOrder,
    const typename Geometry<A>::allocator_type& allocator
)
: allocator_(allocator),
  shape_(allocator_.allocate(std::distance(begin, end) * 3)), 
  shapeStrides_(shape_ + std::distance(begin, end)),
  strides_(shapeStrides_ + std::distance(begin, end)), 
  dimension_(std::distance(begin, end)),
  size_(1),
  coordinateOrder_(internalCoordinateOrder),
  isSimple_(true)
{
    if(dimension_ != 0) { // if the array is not a scalar
        isSimple_ = (externalCoordinateOrder == internalCoordinateOrder);
        for(std::size_t j=0; j<dimension(); ++j, ++begin) {
            const std::size_t s = static_cast<std::size_t>(*begin);
            shape(j) = s;
            size() *= s;
        }
        stridesFromShape(shapeBegin(), shapeEnd(), stridesBegin(), 
            externalCoordinateOrder);
        stridesFromShape(shapeBegin(), shapeEnd(), shapeStridesBegin(), 
            internalCoordinateOrder);
    }
}